

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

section_t init_section(section_type_t t)

{
  assoc_t *paVar1;
  section_t p_Var2;
  
  paVar1 = init_assoc_array();
  p_Var2 = (section_t)malloc(0x10);
  if (p_Var2 != (section_t)0x0) {
    p_Var2->type = t;
    p_Var2->Set = paVar1;
  }
  return p_Var2;
}

Assistant:

section_t init_section(section_type_t t)
{
    section_t s;
    assoc_t *arr;

    arr=init_assoc_array();

    if((s=(section_t)malloc(sizeof (__section_t))) == NULL)
        return NULL;
    s->type = t;
    //s->Set = (assoc_t*)&arr;
    s->Set=arr;

    return s;

}